

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbstrmatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_>::Clone
          (TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0x130);
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix + -0x60);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19b2be8;
  *(undefined8 *)this_00 = 0x19b2cb0;
  *(undefined4 *)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1);
  *(undefined1 *)((long)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019b2500,(TPZStructMatrix *)this);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19b26b8;
  *(undefined8 *)this_00 = 0x19b25d8;
  TPZStructMatrixOT<double>::TPZStructMatrixOT
            ((TPZStructMatrixOT<double> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019b2528,
             (TPZStructMatrixOT<double> *)
             &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.field_0xa0);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19b2480;
  *(undefined8 *)this_00 = 0x19b22b8;
  *(undefined8 *)&this_00->field_0xa0 = 0x19b2378;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZSBandStructMatrix(*this);
}